

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O0

EStatusCode __thiscall
AbstractContentContext::FinishPath(AbstractContentContext *this,GraphicOptions *inOptions)

{
  EDrawingType EVar1;
  EStatusCode EVar2;
  GraphicOptions *inOptions_local;
  AbstractContentContext *this_local;
  
  EVar1 = inOptions->drawingType;
  if (EVar1 == eStroke) {
    if ((inOptions->close & 1U) == 0) {
      S(this);
    }
    else {
      s(this);
    }
  }
  else if (EVar1 == eFill) {
    f(this);
  }
  else if (EVar1 == eClip) {
    if ((inOptions->close & 1U) != 0) {
      h(this);
    }
    W(this);
  }
  EVar2 = GetCurrentStatusCode(this);
  return EVar2;
}

Assistant:

EStatusCode AbstractContentContext::FinishPath(const GraphicOptions& inOptions)
{
	switch(inOptions.drawingType)
	{
		case eStroke:
			{
				if(inOptions.close)
					s();
				else
					S();
				break;
			}
		case eFill:
			{
				f();
				break;
			}
		case eClip:
			{
				if(inOptions.close)
					h();
				W();
				break;
			}

	}
	return GetCurrentStatusCode();
}